

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

ssize_t kvtree_read_fd(char *file,int fd,kvtree *hash)

{
  uint uVar1;
  ssize_t sVar2;
  size_t sVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  size_t size_00;
  char *buf;
  uint16_t version;
  uint16_t type;
  uint64_t filesize;
  size_t size;
  uint32_t flags;
  uint32_t magic;
  char header [20];
  kvtree *tmp_hash;
  void *local_80;
  uint16_t local_74;
  uint16_t local_72;
  int local_70;
  undefined4 uStack_6c;
  size_t local_68;
  byte local_60 [4];
  uint32_t local_5c;
  undefined1 local_58 [32];
  kvtree *local_38;
  
  if ((hash == (kvtree *)0x0 || file == (char *)0x0) || fd < 0) {
    pcVar6 = "Bad file/fd/hash in %s @ %s:%d";
    uVar5 = 0x536;
LAB_001050df:
    kvtree_err(pcVar6,file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,uVar5);
    return -1;
  }
  sVar2 = kvtree_read_attempt(file,fd,local_58,0x14);
  if (sVar2 < 0) {
    pcVar6 = "Failed to read header from %s @ %s:%d";
    uVar5 = 0x540;
    goto LAB_001050df;
  }
  if (sVar2 == 0) {
    return 0;
  }
  if (sVar2 != 0x14) {
    kvtree_err("Invalid header: read %zu bytes but expected %d in %s @ %s:%d",sVar2,0x14,file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,0x54c);
    return -1;
  }
  local_68 = 0;
  kvtree_unpack_uint32_t(local_58,0x14,&local_68,&local_5c);
  kvtree_unpack_uint16_t(local_58,0x14,&local_68,&local_72);
  kvtree_unpack_uint16_t(local_58,0x14,&local_68,&local_74);
  if (((local_5c != 0x951fc3f5) || (local_72 != 1)) || (local_74 != 1)) {
    pcVar6 = "File header does not match expected values in %s @ %s:%d";
    uVar5 = 0x562;
    goto LAB_001050df;
  }
  kvtree_unpack_uint64_t(local_58,0x14,&local_68,(uint64_t *)&local_70);
  kvtree_unpack_uint32_t(local_58,0x14,&local_68,(uint32_t *)local_60);
  if (CONCAT44(uStack_6c,local_70) < 0x14) {
    pcVar6 = "Invalid file size stored in %s @ %s:%d";
    uVar5 = 0x572;
    goto LAB_001050df;
  }
  local_80 = kvtree_malloc(CONCAT44(uStack_6c,local_70),
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                           ,0x578);
  memcpy(local_80,local_58,local_68);
  size_00 = CONCAT44(uStack_6c,local_70) - local_68;
  if ((long)size_00 < 1) {
LAB_0010515a:
    if ((local_60[0] & 1) == 0) {
LAB_00105199:
      local_38 = (kvtree *)
                 kvtree_malloc(8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                               ,0x47);
      local_38->lh_first = (kvtree_elem_struct *)0x0;
      kvtree_unpack((char *)((long)local_80 + local_68),local_38);
      kvtree_merge(hash,local_38);
      kvtree_delete(&local_38);
      kvtree_free(&local_80);
      return CONCAT44(uStack_6c,local_70);
    }
    uVar5 = crc32(0,0,0);
    uVar4 = crc32(uVar5,local_80,local_70 + -4);
    uVar1 = *(uint *)((long)local_80 + CONCAT44(uStack_6c,local_70) + -4);
    if (uVar4 == (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18))
    goto LAB_00105199;
    pcVar6 = "CRC32 mismatch detected in %s @ %s:%d";
    uVar5 = 0x5a1;
  }
  else {
    sVar3 = kvtree_read_attempt(file,fd,(void *)(local_68 + (long)local_80),size_00);
    if (-1 < (long)sVar3) {
      if (sVar3 != size_00) {
        kvtree_err("Failed to read file %s (read %zu bytes but expected %zu: filesize %zu) @ %s:%d",
                   file,sVar3,size_00,CONCAT44(uStack_6c,local_70),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x589);
        goto LAB_00105259;
      }
      goto LAB_0010515a;
    }
    pcVar6 = "Failed to read file %s @ %s:%d";
    uVar5 = 0x583;
  }
  kvtree_err(pcVar6,file,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
             ,uVar5);
LAB_00105259:
  kvtree_free(&local_80);
  return -1;
}

Assistant:

ssize_t kvtree_read_fd(const char* file, int fd, kvtree* hash)
{
  /* check that we have a hash, a file name, and a file descriptor */
  if (file == NULL || fd < 0 || hash == NULL) {
    kvtree_err("Bad file/fd/hash in %s @ %s:%d",
      file, __FILE__, __LINE__);
    return -1;
  }

  /* read in the file header */
  char header[KVTREE_FILE_HASH_HEADER_SIZE];
  ssize_t nread = kvtree_read_attempt(file, fd, header, KVTREE_FILE_HASH_HEADER_SIZE);
  if (nread < 0) {
    /* error while reading header */
    kvtree_err("Failed to read header from %s @ %s:%d",
      file, __FILE__, __LINE__);
    return -1;
  }
  if (nread == 0) {
    /* We've got an empty file.  It depends on the situation as to whether this is
     * an error or not.  Do not print an error, and return 0 so someone can test.
     * Any valid, non-empty file will return a positive size. */
    return 0;
  }
  if (nread != KVTREE_FILE_HASH_HEADER_SIZE) {
    /* read something but the expected size does not match */
    kvtree_err("Invalid header: read %zu bytes but expected %d in %s @ %s:%d",
      nread, KVTREE_FILE_HASH_HEADER_SIZE, file, __FILE__, __LINE__);
    return -1;
  }

  /* track our current offset within the read buffer */
  size_t size = 0;

  /* read in the magic number, the type, and the version number */
  uint32_t magic;
  uint16_t type, version;
  kvtree_unpack_uint32_t(header, sizeof(header), &size, &magic);
  kvtree_unpack_uint16_t(header, sizeof(header), &size, &type);
  kvtree_unpack_uint16_t(header, sizeof(header), &size, &version);

  /* check that the magic number matches */
  /* check that the file type is something we understand */
  /* check that the file version matches */
  if (magic   != KVTREE_FILE_MAGIC ||
      type    != KVTREE_FILE_TYPE_HASH ||
      version != KVTREE_FILE_VERSION_HASH_1)
  {
    kvtree_err("File header does not match expected values in %s @ %s:%d",
      file, __FILE__, __LINE__
    );
    return -1;
  }

  /* read the file size */
  uint64_t filesize;
  kvtree_unpack_uint64_t(header, sizeof(header), &size, &filesize);

  /* read the flags field (32 bits) */
  uint32_t flags;
  kvtree_unpack_uint32_t(header, sizeof(header), &size, &flags);

  /* check that the filesize is valid (positive) */
  if (filesize < KVTREE_FILE_HASH_HEADER_SIZE) {
    kvtree_err("Invalid file size stored in %s @ %s:%d",
      file, __FILE__, __LINE__
    );
    return -1;
  }

  /* allocate a buffer to read the hash and crc */
  char* buf = (char*) KVTREE_MALLOC(filesize);

  /* copy the header into the buffer */
  memcpy(buf, header, size);

  /* read the rest of the file into the buffer */
  ssize_t remainder = filesize - size;
  if (remainder > 0) {
    nread = kvtree_read_attempt(file, fd, buf + size, remainder);
    if (nread < 0) {
      kvtree_err("Failed to read file %s @ %s:%d",
        file, __FILE__, __LINE__);
      kvtree_free(&buf);
      return -1;
    }
    if (nread != remainder) {
      kvtree_err("Failed to read file %s (read %zu bytes but expected %zu: filesize %zu) @ %s:%d",
        file, nread, remainder, filesize, __FILE__, __LINE__);
      kvtree_free(&buf);
      return -1;
    }
  }

  /* check the crc value if it's set */
  int crc_set = flags & KVTREE_FILE_FLAGS_CRC32;
  if (crc_set) {
    /* TODO: we should check that the remainder above is at least 4
     * (for the crc) */

    /* compute the crc value of the data */
    uLong crc = crc32(0L, Z_NULL, 0);
    crc = crc32(crc, (const Bytef*) buf, (uInt) filesize - sizeof(uint32_t));

    /* read the crc value */
    uint32_t crc_file_network, crc_file;
    memcpy(&crc_file_network, buf + filesize - sizeof(uint32_t), sizeof(uint32_t));
    crc_file = kvtree_ntoh32(crc_file_network);

    /* check the crc value */
    if (crc != crc_file) {
      kvtree_err("CRC32 mismatch detected in %s @ %s:%d",
        file, __FILE__, __LINE__
      );
      kvtree_free(&buf);
      return -1;
    }
  }

  /* create a temporary hash to read data into, unpack, and merge */
  kvtree* tmp_hash = kvtree_new();
  kvtree_unpack(buf + size, tmp_hash);
  kvtree_merge(hash, tmp_hash);
  kvtree_delete(&tmp_hash);

  /* free the buffer holding the file contents */
  kvtree_free(&buf);

  return filesize;
}